

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_add_32_er_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint res;
  uint dst;
  uint src;
  uint *r_dst;
  
  uVar2 = m68ki_cpu.ir >> 9;
  uVar3 = OPER_AW_32();
  uVar1 = m68ki_cpu.dar[uVar2 & 7];
  m68ki_cpu.not_z_flag = uVar3 + uVar1;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = ((uVar3 ^ m68ki_cpu.not_z_flag) & (uVar1 ^ m68ki_cpu.not_z_flag)) >> 0x18;
  m68ki_cpu.x_flag = (uVar3 & uVar1 | (m68ki_cpu.not_z_flag ^ 0xffffffff) & (uVar3 | uVar1)) >> 0x17
  ;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_cpu.dar[uVar2 & 7] = m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_add_32_er_aw(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AW_32();
	uint dst = *r_dst;
	uint res = src + dst;

	FLAG_N = NFLAG_32(res);
	FLAG_V = VFLAG_ADD_32(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_ADD_32(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);

	*r_dst = FLAG_Z;
}